

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O3

size_t __thiscall ag::Generator::FunctionManager::If(FunctionManager *this)

{
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *this_00;
  pointer pBVar1;
  size_t sVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  uchar local_31;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&(this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl
              .super__Vector_impl_data._M_start[this->m_cur].m_bytes,&local_31);
  this_00 = (this->m_linkAddr).
            super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_cur;
  lVar5 = (long)(this_00->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(this_00->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::resize(this_00,(lVar5 >> 4) + 1);
  pBVar1 = (this->m_code).super__Vector_base<ag::ByteCode,_std::allocator<ag::ByteCode>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar2 = this->m_cur;
  lVar3 = *(long *)&(this->m_linkAddr).
                    super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar2].
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data;
  *(long *)(lVar3 + lVar5) =
       (long)*(pointer *)
              ((long)&pBVar1[sVar2].m_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8)
       - *(long *)&pBVar1[sVar2].m_bytes.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl;
  *(undefined8 *)(lVar3 + 8 + lVar5) = 0;
  puVar4 = (undefined4 *)operator_new(4);
  *puVar4 = 0;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)(pBVar1 + sVar2),
             *(pointer *)
              ((long)&pBVar1[sVar2].m_bytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 8)
             ,puVar4,puVar4 + 1);
  operator_delete(puVar4,4);
  return lVar5 >> 4;
}

Assistant:

inline size_t If()
			{
				m_code[m_cur].Add(OpCode::If);

				size_t cur_if = m_linkAddr[m_cur].size();
				m_linkAddr[m_cur].resize(cur_if + 1);
				m_linkAddr[m_cur][cur_if] = std::make_pair(m_code[m_cur].Count(), 0);

				m_code[m_cur].Add(BitConverter::GetUInt32(0u));

				return cur_if;
			}